

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

bool __thiscall
basisu::tree_vector_quant<basisu::vec<16U,_float>_>::refine_split
          (tree_vector_quant<basisu::vec<16U,_float>_> *this,tsvq_node *node,
          vec<16U,_float> *l_child,uint64_t *l_weight,float *l_var,vector<unsigned_int> *l_children,
          vec<16U,_float> *r_child,uint64_t *r_weight,float *r_var,vector<unsigned_int> *r_children)

{
  vector<unsigned_int> *this_00;
  ulong uVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  uint *puVar5;
  pair<basisu::vec<16U,_float>,_unsigned_long> *ppVar6;
  pair<basisu::vec<16U,_float>,_unsigned_long> *ppVar7;
  array_of_weighted_training_vecs *this_01;
  vector<unsigned_int> *pvVar8;
  uint32_t i;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  vec<16U,_float> new_l_child;
  vec<16U,_float> new_r_child;
  vec<16U,_float> firstVec;
  vec<16U,_float> local_130;
  vec<16U,_float> local_f0;
  vec<16U,_float> local_b0;
  vec<16U,_float> local_70;
  
  this_00 = &node->m_training_vecs;
  vector<unsigned_int>::reserve(l_children,(ulong)(node->m_training_vecs).m_size);
  vector<unsigned_int>::reserve(r_children,(ulong)(node->m_training_vecs).m_size);
  this_01 = &this->m_training_vecs;
  iVar4 = 0;
  fVar10 = 1e+10;
  while( true ) {
    if (iVar4 == 6) {
      return true;
    }
    vector<unsigned_int>::resize(l_children,0,false);
    vector<unsigned_int>::resize(r_children,0,false);
    vec<16U,_float>::set_zero(&local_130);
    vec<16U,_float>::set_zero(&local_f0);
    *l_weight = 0;
    *r_weight = 0;
    fVar2 = 0.0;
    fVar13 = 0.0;
    for (uVar9 = 0; uVar9 < (node->m_training_vecs).m_size; uVar9 = uVar9 + 1) {
      puVar5 = vector<unsigned_int>::operator[](this_00,uVar9);
      ppVar6 = vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_>::operator[]
                         (this_01,(ulong)*puVar5);
      puVar5 = vector<unsigned_int>::operator[](this_00,uVar9);
      ppVar7 = vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_>::operator[]
                         (this_01,(ulong)*puVar5);
      uVar1 = ppVar7->second;
      dVar14 = vec<16U,_float>::squared_distance_d(l_child,&ppVar6->first);
      dVar15 = vec<16U,_float>::squared_distance_d(r_child,&ppVar6->first);
      fVar12 = (float)uVar1;
      if (dVar15 <= dVar14) {
        operator*(&ppVar6->first,fVar12);
        vec<16U,_float>::operator+=(&local_f0,&local_b0);
        *r_weight = *r_weight + uVar1;
        fVar11 = vec<16U,_float>::dot_product(&ppVar6->first,&ppVar6->first);
        fVar2 = fVar2 + fVar11 * fVar12;
        pvVar8 = r_children;
      }
      else {
        operator*(&ppVar6->first,fVar12);
        vec<16U,_float>::operator+=(&local_130,&local_b0);
        *l_weight = *l_weight + uVar1;
        fVar11 = vec<16U,_float>::dot_product(&ppVar6->first,&ppVar6->first);
        fVar13 = fVar13 + fVar11 * fVar12;
        pvVar8 = l_children;
      }
      puVar5 = vector<unsigned_int>::operator[](this_00,uVar9);
      vector<unsigned_int>::push_back(pvVar8,puVar5);
    }
    if ((*l_weight == 0) || (*r_weight == 0)) {
      vector<unsigned_int>::resize(l_children,0,false);
      vec<16U,_float>::set(&local_130,0.0);
      *l_weight = 0;
      vector<unsigned_int>::resize(r_children,0,false);
      vec<16U,_float>::set(&local_f0,0.0);
      *r_weight = 0;
      fVar2 = 0.0;
      fVar13 = 0.0;
      for (uVar9 = 0; uVar9 < (node->m_training_vecs).m_size; uVar9 = uVar9 + 1) {
        puVar5 = vector<unsigned_int>::operator[](this_00,uVar9);
        ppVar6 = vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_>::operator[]
                           (this_01,(ulong)*puVar5);
        puVar5 = vector<unsigned_int>::operator[](this_00,uVar9);
        ppVar7 = vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_>::operator[]
                           (this_01,(ulong)*puVar5);
        uVar1 = ppVar7->second;
        if ((uVar9 == 0) || (bVar3 = vec<16U,_float>::operator==(&ppVar6->first,&local_b0), bVar3))
        {
          vec<16U,_float>::operator=(&local_b0,&ppVar6->first);
          operator*(&ppVar6->first,(float)uVar1);
          vec<16U,_float>::operator+=(&local_f0,&local_70);
          *r_weight = *r_weight + uVar1;
          fVar12 = vec<16U,_float>::dot_product(&ppVar6->first,&ppVar6->first);
          fVar2 = fVar2 + fVar12 * (float)uVar1;
          pvVar8 = r_children;
        }
        else {
          operator*(&ppVar6->first,(float)uVar1);
          vec<16U,_float>::operator+=(&local_130,&local_70);
          *l_weight = *l_weight + uVar1;
          fVar12 = vec<16U,_float>::dot_product(&ppVar6->first,&ppVar6->first);
          fVar13 = fVar13 + fVar12 * (float)uVar1;
          pvVar8 = l_children;
        }
        puVar5 = vector<unsigned_int>::operator[](this_00,uVar9);
        vector<unsigned_int>::push_back(pvVar8,puVar5);
      }
      if (*l_weight == 0) {
        return false;
      }
      if (*r_weight == 0) {
        return false;
      }
    }
    fVar12 = vec<16U,_float>::dot_product(&local_130,&local_130);
    *l_var = fVar13 - fVar12 / (float)*l_weight;
    fVar13 = vec<16U,_float>::dot_product(&local_f0,&local_f0);
    *r_var = fVar2 - fVar13 / (float)*r_weight;
    vec<16U,_float>::operator*=(&local_130,1.0 / (float)*l_weight);
    vec<16U,_float>::operator*=(&local_f0,1.0 / (float)*r_weight);
    vec<16U,_float>::operator=(l_child,&local_130);
    vec<16U,_float>::operator=(r_child,&local_f0);
    fVar13 = *l_var + *r_var;
    if (fVar13 < 1e-05) {
      return true;
    }
    if ((fVar10 - fVar13) / fVar13 < 0.00125) break;
    iVar4 = iVar4 + 1;
    fVar10 = fVar13;
  }
  return true;
}

Assistant:

bool refine_split(const tsvq_node &node,
			TrainingVectorType &l_child, uint64_t &l_weight, float &l_var, basisu::vector<uint32_t> &l_children,
			TrainingVectorType &r_child, uint64_t &r_weight, float &r_var, basisu::vector<uint32_t> &r_children) const
		{
			l_children.reserve(node.m_training_vecs.size());
			r_children.reserve(node.m_training_vecs.size());

			float prev_total_variance = 1e+10f;

			// Refine left/right children locations using k-means iterations
			const uint32_t cMaxIters = 6;
			for (uint32_t iter = 0; iter < cMaxIters; iter++)
			{
				l_children.resize(0); 
				r_children.resize(0); 

				TrainingVectorType new_l_child(cZero), new_r_child(cZero);

				double l_ttsum = 0.0f, r_ttsum = 0.0f;

				l_weight = 0;
				r_weight = 0;

				for (uint32_t i = 0; i < node.m_training_vecs.size(); i++)
				{
					const TrainingVectorType &v = m_training_vecs[node.m_training_vecs[i]].first;
					const uint64_t weight = m_training_vecs[node.m_training_vecs[i]].second;

					double left_dist2 = l_child.squared_distance_d(v), right_dist2 = r_child.squared_distance_d(v);

					if (left_dist2 >= right_dist2)
					{
						new_r_child += (v * static_cast<float>(weight));
						r_weight += weight;

						r_ttsum += weight * v.dot(v);
						r_children.push_back(node.m_training_vecs[i]);
					}
					else
					{
						new_l_child += (v * static_cast<float>(weight));
						l_weight += weight;

						l_ttsum += weight * v.dot(v);
						l_children.push_back(node.m_training_vecs[i]);
					}
				}

				// Node is unsplittable using the above algorithm - try something else to split it up.
				if ((!l_weight) || (!r_weight))
				{
					l_children.resize(0);
					new_l_child.set(0.0f);
					l_ttsum = 0.0f;
					l_weight = 0;

					r_children.resize(0);
					new_r_child.set(0.0f);
					r_ttsum = 0.0f;
					r_weight = 0;

					TrainingVectorType firstVec;
					for (uint32_t i = 0; i < node.m_training_vecs.size(); i++)
					{
						const TrainingVectorType& v = m_training_vecs[node.m_training_vecs[i]].first;
						const uint64_t weight = m_training_vecs[node.m_training_vecs[i]].second;
					
						if ((!i) || (v == firstVec))
						{
							firstVec = v;

							new_r_child += (v * static_cast<float>(weight));
							r_weight += weight;

							r_ttsum += weight * v.dot(v);
							r_children.push_back(node.m_training_vecs[i]);
						}
						else
						{
							new_l_child += (v * static_cast<float>(weight));
							l_weight += weight;

							l_ttsum += weight * v.dot(v);
							l_children.push_back(node.m_training_vecs[i]);
						}
					}

					if ((!l_weight) || (!r_weight))
						return false;
				}

				l_var = static_cast<float>(l_ttsum - (new_l_child.dot(new_l_child) / l_weight));
				r_var = static_cast<float>(r_ttsum - (new_r_child.dot(new_r_child) / r_weight));

				new_l_child *= (1.0f / l_weight);
				new_r_child *= (1.0f / r_weight);

				l_child = new_l_child;
				r_child = new_r_child;

				float total_var = l_var + r_var;
				const float cGiveupVariance = .00001f;
				if (total_var < cGiveupVariance)
					break;

				// Check to see if the variance has settled
				const float cVarianceDeltaThresh = .00125f;
				if (((prev_total_variance - total_var) / total_var) < cVarianceDeltaThresh)
					break;

				prev_total_variance = total_var;
			}

			return true;
		}